

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner_impl.hpp
# Opt level: O2

string * __thiscall
toml::detail::repeat_exact::expected_chars_abi_cxx11_
          (string *__return_storage_ptr__,repeat_exact *this,location *loc)

{
  _Head_base<0UL,_toml::detail::scanner_base_*,_false> _Var1;
  ulong uVar2;
  region reg;
  region local_90;
  
  uVar2 = 0;
  while( true ) {
    if (this->length_ <= uVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_90);
      return __return_storage_ptr__;
    }
    _Var1._M_head_impl =
         (this->other_).scanner_._M_t.
         super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
         ._M_t.
         super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
         .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl;
    (*(_Var1._M_head_impl)->_vptr_scanner_base[2])(&local_90,_Var1._M_head_impl,loc);
    if (local_90.source_.
        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr == (element_type *)0x0) break;
    region::~region(&local_90);
    uVar2 = uVar2 + 1;
  }
  _Var1._M_head_impl =
       (this->other_).scanner_._M_t.
       super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
       ._M_t.
       super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
       .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl;
  (*(_Var1._M_head_impl)->_vptr_scanner_base[4])(__return_storage_ptr__,_Var1._M_head_impl,loc);
  region::~region(&local_90);
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE std::string repeat_exact::expected_chars(location& loc) const
{
    for(std::size_t i=0; i<length_; ++i)
    {
        const auto reg = other_.scan(loc);
        if( ! reg.is_ok())
        {
            return other_.expected_chars(loc);
        }
    }
    assert(false);
    return "";
}